

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_update_fg_62_var
               (int len,secp256k1_modinv64_signed62 *f,secp256k1_modinv64_signed62 *g,
               secp256k1_modinv64_trans2x2 *t)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  secp256k1_int128 cf;
  secp256k1_int128 cg;
  int64_t local_58;
  long local_50;
  int64_t local_48;
  long local_40;
  ulong local_38;
  
  if (len < 1) {
    pcVar7 = "test condition failed: len > 0";
    uVar5 = 0x22f;
  }
  else {
    local_40 = t->u;
    local_48 = t->v;
    lVar1 = t->q;
    iVar4 = t->r;
    lVar2 = f->v[0];
    iVar3 = g->v[0];
    cf._0_8_ = lVar2 * local_40;
    cf._8_8_ = SUB168(SEXT816(lVar2) * SEXT816(local_40),8);
    secp256k1_i128_accum_mul(&cf,local_48,iVar3);
    cg._0_8_ = lVar2 * lVar1;
    cg._8_8_ = SUB168(SEXT816(lVar2) * SEXT816(lVar1),8);
    local_58 = iVar4;
    local_50 = lVar1;
    secp256k1_i128_accum_mul(&cg,iVar4,iVar3);
    if (((ulong)cf & 0x3fffffffffffffff) == 0) {
      cf._0_8_ = (ulong)cf >> 0x3e | cf._8_8_ << 2;
      cf._8_8_ = cf._8_8_ >> 0x3e;
      if (((ulong)cg & 0x3fffffffffffffff) == 0) {
        cg._0_8_ = (ulong)cg >> 0x3e | cg._8_8_ << 2;
        local_38 = (ulong)(uint)len;
        for (uVar6 = 1; cg._8_8_ = cg._8_8_ >> 0x3e, local_38 != uVar6; uVar6 = uVar6 + 1) {
          iVar4 = f->v[uVar6];
          iVar3 = g->v[uVar6];
          secp256k1_i128_accum_mul(&cf,local_40,iVar4);
          secp256k1_i128_accum_mul(&cf,local_48,iVar3);
          secp256k1_i128_accum_mul(&cg,local_50,iVar4);
          secp256k1_i128_accum_mul(&cg,local_58,iVar3);
          f->v[uVar6 - 1] = (ulong)cf & 0x3fffffffffffffff;
          cf._0_8_ = (ulong)cf >> 0x3e | cf._8_8_ << 2;
          cf._8_8_ = cf._8_8_ >> 0x3e;
          g->v[uVar6 - 1] = (ulong)cg & 0x3fffffffffffffff;
          cg._0_8_ = (ulong)cg >> 0x3e | cg._8_8_ << 2;
        }
        iVar4 = secp256k1_i128_to_i64(&cf);
        f->v[(long)len + -1] = iVar4;
        iVar4 = secp256k1_i128_to_i64(&cg);
        g->v[(long)len + -1] = iVar4;
        return;
      }
      pcVar7 = "test condition failed: (secp256k1_i128_to_u64(&cg) & M62) == 0";
      uVar5 = 0x239;
    }
    else {
      pcVar7 = "test condition failed: (secp256k1_i128_to_u64(&cf) & M62) == 0";
      uVar5 = 0x238;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,uVar5,pcVar7);
  abort();
}

Assistant:

static void secp256k1_modinv64_update_fg_62_var(int len, secp256k1_modinv64_signed62 *f, secp256k1_modinv64_signed62 *g, const secp256k1_modinv64_trans2x2 *t) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t fi, gi;
    secp256k1_int128 cf, cg;
    int i;
    VERIFY_CHECK(len > 0);
    /* Start computing t*[f,g]. */
    fi = f->v[0];
    gi = g->v[0];
    secp256k1_i128_mul(&cf, u, fi);
    secp256k1_i128_accum_mul(&cf, v, gi);
    secp256k1_i128_mul(&cg, q, fi);
    secp256k1_i128_accum_mul(&cg, r, gi);
    /* Verify that the bottom 62 bits of the result are zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cf) & M62) == 0); secp256k1_i128_rshift(&cf, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&cg) & M62) == 0); secp256k1_i128_rshift(&cg, 62);
    /* Now iteratively compute limb i=1..len of t*[f,g], and store them in output limb i-1 (shifting
     * down by 62 bits). */
    for (i = 1; i < len; ++i) {
        fi = f->v[i];
        gi = g->v[i];
        secp256k1_i128_accum_mul(&cf, u, fi);
        secp256k1_i128_accum_mul(&cf, v, gi);
        secp256k1_i128_accum_mul(&cg, q, fi);
        secp256k1_i128_accum_mul(&cg, r, gi);
        f->v[i - 1] = secp256k1_i128_to_u64(&cf) & M62; secp256k1_i128_rshift(&cf, 62);
        g->v[i - 1] = secp256k1_i128_to_u64(&cg) & M62; secp256k1_i128_rshift(&cg, 62);
    }
    /* What remains is limb (len) of t*[f,g]; store it as output limb (len-1). */
    f->v[len - 1] = secp256k1_i128_to_i64(&cf);
    g->v[len - 1] = secp256k1_i128_to_i64(&cg);
}